

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

connection_context_t * create_connection_context(uv_os_sock_t sock,int is_server_connection)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  connection_context_t *pcVar4;
  ssize_t sVar5;
  ulong uVar6;
  connection_context_t *extraout_RAX;
  int *piVar7;
  connection_context_t *extraout_RAX_00;
  long extraout_RAX_01;
  long lVar8;
  connection_context_t *extraout_RAX_02;
  connection_context_t *extraout_RAX_03;
  uint extraout_EDX;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  connection_context_t *pcVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  undefined8 *__ptr;
  
  plVar13 = (long *)0x170;
  iVar10 = is_server_connection;
  pcVar4 = (connection_context_t *)malloc(0x170);
  if (pcVar4 == (connection_context_t *)0x0) {
    create_connection_context_cold_3();
LAB_00167a24:
    create_connection_context_cold_1();
  }
  else {
    pcVar4->sock = sock;
    pcVar4->is_server_connection = is_server_connection;
    pcVar4->read = 0;
    pcVar4->sent = 0;
    pcVar4->open_handles = 0;
    pcVar4->got_fin = 0;
    pcVar4->sent_fin = 0;
    pcVar4->got_disconnect = 0;
    pcVar4->events = 0;
    pcVar4->delayed_events = 0;
    plVar13 = (long *)uv_default_loop();
    pcVar12 = pcVar4;
    iVar2 = uv_poll_init_socket(plVar13,pcVar4,sock);
    iVar10 = (int)pcVar12;
    pcVar4->open_handles = pcVar4->open_handles + 1;
    (pcVar4->poll_handle).data = pcVar4;
    if (iVar2 != 0) goto LAB_00167a24;
    plVar13 = (long *)uv_default_loop();
    iVar10 = (int)pcVar4 + 0xa0;
    iVar2 = uv_timer_init();
    pcVar4->open_handles = pcVar4->open_handles + 1;
    (pcVar4->timer_handle).data = pcVar4;
    if (iVar2 == 0) {
      return pcVar4;
    }
  }
  create_connection_context_cold_2();
  plVar14 = plVar13;
  if (iVar10 == 0) {
    plVar1 = (long *)*plVar13;
    uVar11 = *(uint *)((long)plVar1 + 0x164);
    if ((uVar11 & extraout_EDX) == 0) goto LAB_00167f44;
    if ((~uVar11 & extraout_EDX) != 0) goto LAB_00167f49;
    if ((extraout_EDX & 1) == 0) goto switchD_00167ab1_caseD_4;
    iVar10 = rand();
    switch(iVar10 % 7) {
    case 0:
    case 1:
      plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
      sVar5 = recv(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer,0x4a,0);
      uVar3 = (uint)sVar5;
      if (-1 < (int)uVar3) {
        if (uVar3 == 0) goto LAB_00167b56;
        plVar1[0x28] = plVar1[0x28] + (ulong)(uVar3 & 0x7fffffff);
        break;
      }
      goto LAB_00167f58;
    case 2:
    case 3:
      plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
      uVar6 = recv(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
      if (-1 < (int)uVar6) {
        if ((int)uVar6 != 0) {
          do {
            plVar1[0x28] = plVar1[0x28] + (uVar6 & 0xffffffff);
            plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
            uVar6 = recv(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
          } while (0 < (int)uVar6);
          if ((int)uVar6 != 0) {
            piVar7 = __errno_location();
            if ((*piVar7 == 0xb) || (*piVar7 == 0x73)) break;
            connection_poll_cb_cold_4();
          }
        }
LAB_00167b56:
        *(undefined4 *)(plVar1 + 0x2b) = 1;
        uVar11 = uVar11 & 0xfffffffe;
        break;
      }
      goto LAB_00167f5d;
    case 4:
      break;
    case 5:
      uVar11 = uVar11 & 0xfffffffe;
      plVar14 = plVar1 + 0x14;
      plVar15 = plVar14;
      iVar10 = uv_is_active();
      if (iVar10 == 0) {
        *(undefined4 *)(plVar1 + 0x2d) = 1;
        uv_timer_start(plVar14,delay_timer_cb,10,0);
      }
      else {
        *(byte *)(plVar1 + 0x2d) = *(byte *)(plVar1 + 0x2d) | 1;
        plVar14 = plVar15;
      }
      break;
    case 6:
      uv_poll_start(plVar1,2,connection_poll_cb);
      plVar14 = plVar1;
      uv_poll_start(plVar1,1,connection_poll_cb);
      *(undefined4 *)((long)plVar1 + 0x164) = 1;
      break;
    default:
      goto switchD_00167ab1_default;
    }
switchD_00167ab1_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_00167d40_caseD_4;
    if (((ulong)plVar1[0x29] < 0x10000) && ((test_mode != '\x01' || (*(int *)(plVar1 + 0x2a) == 0)))
       ) {
      iVar10 = rand();
      switch(iVar10 % 7) {
      case 0:
      case 1:
        if (plVar1[0x29] == 0x10000) goto LAB_00167f67;
        uVar6 = 0x10000 - plVar1[0x29];
        sVar9 = 0x67;
        if (uVar6 < 0x67) {
          sVar9 = uVar6;
        }
        plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
        sVar5 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_2,sVar9,0);
        uVar3 = (uint)sVar5;
        if ((int)uVar3 < 0) {
          piVar7 = __errno_location();
          if ((*piVar7 != 0xb) && (*piVar7 != 0x73)) {
            connection_poll_cb_cold_13();
            goto LAB_00167edb;
          }
LAB_00167ef0:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        if (uVar3 != 0) {
          plVar1[0x29] = plVar1[0x29] + (ulong)(uVar3 & 0x7fffffff);
          valid_writable_wakeups = valid_writable_wakeups + 1;
          break;
        }
        goto LAB_00167f71;
      case 2:
      case 3:
        if (plVar1[0x29] == 0x10000) goto LAB_00167f6c;
        sVar9 = 0x10000 - plVar1[0x29];
        if (0x4d1 < sVar9) {
          sVar9 = 0x4d2;
        }
        plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
        sVar5 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_3,sVar9,0);
        uVar3 = (uint)sVar5;
        if (-1 < (int)uVar3) {
          if (uVar3 != 0) {
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar6 = (ulong)(uVar3 & 0x7fffffff) + plVar1[0x29];
            plVar1[0x29] = uVar6;
            while (uVar6 < 0x10000) {
              sVar9 = 0x10000 - uVar6;
              if (uVar6 < 0xfb2f) {
                sVar9 = 0x4d2;
              }
              plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
              sVar5 = send(*(uint *)(plVar1 + 0x27),connection_poll_cb::buffer_3,sVar9,0);
              if ((int)(uint)sVar5 < 1) {
                piVar7 = __errno_location();
                if ((*piVar7 != 0xb) && (*piVar7 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_00167f3f;
                }
                break;
              }
              uVar6 = (ulong)((uint)sVar5 & 0x7fffffff) + plVar1[0x29];
              plVar1[0x29] = uVar6;
            }
            break;
          }
          goto LAB_00167f76;
        }
LAB_00167edb:
        piVar7 = __errno_location();
        if ((*piVar7 == 0xb) || (*piVar7 == 0x73)) goto LAB_00167ef0;
        goto LAB_00167f80;
      case 4:
        break;
      case 5:
        uVar11 = uVar11 & 0xfffffffd;
        iVar10 = uv_is_active(plVar1 + 0x14);
        if (iVar10 == 0) {
          *(undefined4 *)(plVar1 + 0x2d) = 2;
          uv_timer_start(plVar1 + 0x14,delay_timer_cb,100,0);
        }
        else {
          *(byte *)(plVar1 + 0x2d) = *(byte *)(plVar1 + 0x2d) | 2;
        }
        break;
      case 6:
        uv_poll_start(plVar1,1,connection_poll_cb);
        uv_poll_start(plVar1,2,connection_poll_cb);
        *(undefined4 *)((long)plVar1 + 0x164) = 2;
        break;
      default:
        goto switchD_00167d40_default;
      }
switchD_00167d40_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(plVar1 + 0x2c) = 1;
        disconnects = disconnects + 1;
        uVar11 = uVar11 & 0xfffffffb;
      }
      if (((*(int *)(plVar1 + 0x2b) == 0) || (*(int *)((long)plVar1 + 0x15c) == 0)) ||
         (*(int *)(plVar1 + 0x2c) == 0)) {
        if (uVar11 != *(uint *)((long)plVar1 + 0x164)) {
          *(uint *)((long)plVar1 + 0x164) = uVar11;
          uv_poll_start(plVar13,uVar11,connection_poll_cb);
          uVar11 = *(uint *)((long)plVar1 + 0x164);
        }
        if (uVar11 != 0) {
          pcVar4 = (connection_context_t *)uv_is_active(plVar13);
          if ((int)pcVar4 == 1) {
            return pcVar4;
          }
          connection_poll_cb_cold_16();
        }
      }
      else {
        close_socket(*(uv_os_sock_t *)(plVar1 + 0x27));
        uv_close(plVar1,connection_close_cb);
        uv_close(plVar1 + 0x14,connection_close_cb);
        *(undefined4 *)((long)plVar1 + 0x164) = 0;
      }
      pcVar4 = (connection_context_t *)uv_is_active();
      if ((int)pcVar4 == 0) {
        return pcVar4;
      }
      goto LAB_00167f4e;
    }
    plVar14 = (long *)(ulong)*(uint *)(plVar1 + 0x27);
    iVar10 = shutdown(*(uint *)(plVar1 + 0x27),1);
    if (iVar10 == 0) {
      *(undefined4 *)((long)plVar1 + 0x15c) = 1;
      uVar11 = uVar11 & 0xfffffffd;
      goto switchD_00167d40_caseD_4;
    }
  }
  else {
LAB_00167f3f:
    connection_poll_cb_cold_1();
    plVar13 = plVar14;
LAB_00167f44:
    connection_poll_cb_cold_18();
LAB_00167f49:
    connection_poll_cb_cold_2();
LAB_00167f4e:
    connection_poll_cb_cold_17();
    plVar14 = plVar13;
  }
  connection_poll_cb_cold_7();
LAB_00167f58:
  connection_poll_cb_cold_5();
LAB_00167f5d:
  connection_poll_cb_cold_3();
switchD_00167ab1_default:
  connection_poll_cb_cold_6();
LAB_00167f67:
  connection_poll_cb_cold_14();
LAB_00167f6c:
  connection_poll_cb_cold_11();
LAB_00167f71:
  connection_poll_cb_cold_12();
LAB_00167f76:
  connection_poll_cb_cold_9();
switchD_00167d40_default:
  connection_poll_cb_cold_15();
LAB_00167f80:
  connection_poll_cb_cold_10();
  iVar10 = close((int)plVar14);
  if ((iVar10 == 0) || (piVar7 = __errno_location(), *piVar7 == 0x68)) {
    return extraout_RAX;
  }
  close_socket_cold_1();
  plVar13 = (long *)*plVar14;
  iVar10 = uv_is_active();
  if (iVar10 == 0) {
    if (*(uint *)(plVar13 + 0x2d) == 0) goto LAB_00167fe7;
    uVar11 = *(uint *)(plVar13 + 0x2d) | *(uint *)((long)plVar13 + 0x164);
    *(uint *)((long)plVar13 + 0x164) = uVar11;
    *(undefined4 *)(plVar13 + 0x2d) = 0;
    pcVar4 = (connection_context_t *)uv_poll_start(plVar13,uVar11,connection_poll_cb);
    if ((int)pcVar4 == 0) {
      return pcVar4;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_00167fe7:
    plVar13 = plVar14;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)*plVar13;
  piVar7 = (int *)((long)__ptr + 0x154);
  *piVar7 = *piVar7 + -1;
  if (*piVar7 != 0) {
    return extraout_RAX_00;
  }
  if (test_mode == '\x01') {
    lVar8 = __ptr[0x28];
    if (*(int *)(__ptr + 0x2a) != 0) {
      if (lVar8 == 0x10000) {
        if (__ptr[0x29] == 0) goto LAB_00168053;
        connection_close_cb_cold_2();
        goto LAB_0016802f;
      }
      goto LAB_0016803c;
    }
LAB_00168041:
    if (lVar8 != 0) goto LAB_00168064;
  }
  else {
LAB_0016802f:
    if (__ptr[0x28] != 0x10000) {
LAB_0016803c:
      connection_close_cb_cold_1();
      lVar8 = extraout_RAX_01;
      goto LAB_00168041;
    }
  }
  if (__ptr[0x29] == 0x10000) {
LAB_00168053:
    closed_connections = closed_connections + 1;
    free(__ptr);
    return extraout_RAX_02;
  }
  connection_close_cb_cold_4();
LAB_00168064:
  connection_close_cb_cold_3();
  free((void *)*__ptr);
  return extraout_RAX_03;
}

Assistant:

static connection_context_t* create_connection_context(
    uv_os_sock_t sock, int is_server_connection) {
  int r;
  connection_context_t* context;

  context = (connection_context_t*) malloc(sizeof *context);
  ASSERT(context != NULL);

  context->sock = sock;
  context->is_server_connection = is_server_connection;
  context->read = 0;
  context->sent = 0;
  context->open_handles = 0;
  context->events = 0;
  context->delayed_events = 0;
  context->got_fin = 0;
  context->sent_fin = 0;
  context->got_disconnect = 0;

  r = uv_poll_init_socket(uv_default_loop(), &context->poll_handle, sock);
  context->open_handles++;
  context->poll_handle.data = context;
  ASSERT(r == 0);

  r = uv_timer_init(uv_default_loop(), &context->timer_handle);
  context->open_handles++;
  context->timer_handle.data = context;
  ASSERT(r == 0);

  return context;
}